

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O1

void __thiscall
Pubkey_CompressUncompressTest_Test::TestBody(Pubkey_CompressUncompressTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  Pubkey uncomp_pubkey;
  Pubkey comp_pubkey;
  Pubkey pubkey;
  string ext_key_compressed;
  string ext_key_uncompressed;
  string key_uncompressed;
  string local_108;
  AssertHelper local_e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertHelper local_d8;
  Pubkey local_d0;
  Pubkey local_b8;
  Pubkey local_a0;
  char *local_88 [2];
  char local_78 [16];
  char *local_68 [2];
  char local_58 [16];
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "076468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73"
             ,"");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "046468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73"
             ,"");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"036468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955"
             ,"");
  cfd::core::Pubkey::Pubkey(&local_a0,&local_48);
  cfd::core::Pubkey::Compress(&local_b8,&local_a0);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_108,&local_b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d0,"comp_pubkey.GetHex().c_str()","ext_key_compressed.c_str()",
             local_108._M_dataplus._M_p,local_88[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_d0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0xcc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)local_108._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_108._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_108._M_dataplus._M_p + 8))();
      }
      local_108._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_d0.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Pubkey::Uncompress(&local_d0,&local_b8);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_108,&local_d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e8,"uncomp_pubkey.GetHex().c_str()","ext_key_uncompressed.c_str()",
             local_108._M_dataplus._M_p,local_68[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_pubkey.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if ((long *)local_108._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_108._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_108._M_dataplus._M_p + 8))();
      }
      local_108._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((void *)CONCAT71(local_d0.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       local_d0.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_d0.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_d0.data_.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_b8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Pubkey, CompressUncompressTest) {
  std::string key_uncompressed = "076468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73";
  std::string ext_key_uncompressed = "046468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73";
  std::string ext_key_compressed = "036468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955";
  Pubkey pubkey = Pubkey(key_uncompressed);
  Pubkey comp_pubkey = pubkey.Compress();
  EXPECT_STREQ(comp_pubkey.GetHex().c_str(), ext_key_compressed.c_str());

  Pubkey uncomp_pubkey = comp_pubkey.Uncompress();
  EXPECT_STREQ(uncomp_pubkey.GetHex().c_str(), ext_key_uncompressed.c_str());
}